

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void process_init_field_designator
               (c2m_ctx_t c2m_ctx,node_t_conflict designator_member,type *container_type)

{
  VARR_init_object_t *pVVar1;
  void *pvVar2;
  c2m_ctx_t pcVar3;
  VARR_node_t *pVVar4;
  init_object_t *__ptr;
  node_t_conflict pnVar5;
  size_t sVar6;
  ulong uVar7;
  char *extraout_RDX;
  undefined4 unaff_EBP;
  node_t_conflict __size;
  c2m_ctx_t pcVar8;
  anon_union_8_2_e4b0c9a5_for_u *paVar9;
  node_t pnVar10;
  pos_t p;
  
  if (designator_member->code != N_MEMBER) {
LAB_0018881e:
    __assert_fail("designator_member->code == N_MEMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
  }
  pVVar1 = c2m_ctx->init_object_path;
  if (pVVar1 == (VARR_init_object_t *)0x0) {
    process_init_field_designator_cold_8();
  }
  else {
    sVar6 = pVVar1->els_num;
    pcVar8 = c2m_ctx;
    if (sVar6 != 0) {
      pcVar8 = (c2m_ctx_t)(sVar6 * 3);
      paVar9 = &pVVar1->varr[sVar6 - 1].u;
      do {
        sVar6 = sVar6 - 1;
        if (pVVar1->varr == (init_object_t *)0x0) goto LAB_00188819;
        unaff_EBP = *(undefined4 *)((long)paVar9 + -4);
        if (((*(int *)(paVar9 + -1) == 0) ||
            (pcVar8 = (c2m_ctx_t)paVar9->curr_member->attr, pcVar8 == (c2m_ctx_t)0x0)) ||
           (pcVar8 = (c2m_ctx_t)pcVar8->env[0].__jmpbuf[6],
           *(char *)((long)pcVar8->env[0].__jmpbuf + 0xd) == '\0')) break;
        container_type = ((init_object_t *)(paVar9 + -2))->container_type;
        pVVar1->els_num = sVar6;
        paVar9 = paVar9 + -3;
      } while (sVar6 != 0);
    }
    pVVar4 = c2m_ctx->containing_anon_members;
    if (pVVar4 != (VARR_node_t *)0x0) {
      if (pVVar4->els_num == 0) {
        pnVar10 = *(node_t *)((long)designator_member->attr + 0x48);
        __size = designator_member;
        if (pnVar10 == (node_t)0x0) goto LAB_00188876;
        do {
          pVVar4 = c2m_ctx->containing_anon_members;
          pcVar3 = (c2m_ctx_t)pVVar4->varr;
          if (pcVar3 == (c2m_ctx_t)0x0) {
            process_init_field_designator_cold_2();
LAB_00188819:
            process_init_field_designator_cold_1();
            goto LAB_0018881e;
          }
          sVar6 = pVVar4->els_num;
          pvVar2 = pnVar10->attr;
          uVar7 = sVar6 + 1;
          if (pVVar4->size < uVar7) {
            sVar6 = (uVar7 >> 1) + uVar7;
            __size = (node_t_conflict)(sVar6 * 8);
            pcVar8 = pcVar3;
            pcVar3 = (c2m_ctx_t)realloc(pcVar3,(size_t)__size);
            pVVar4->varr = (node_t_conflict *)pcVar3;
            pVVar4->size = sVar6;
            sVar6 = pVVar4->els_num;
            uVar7 = sVar6 + 1;
          }
          pVVar4->els_num = uVar7;
          pcVar3->env[0].__jmpbuf[sVar6 - 2] = (long)pnVar10;
          pnVar10 = *(node_t *)((long)pvVar2 + 0x48);
        } while (pnVar10 != (node_t)0x0);
        do {
          pVVar4 = c2m_ctx->containing_anon_members;
          if (pVVar4 == (VARR_node_t *)0x0) {
            process_init_field_designator_cold_3();
LAB_0018899d:
            process_init_field_designator_cold_5();
LAB_001889a2:
            designator_member = (node_t_conflict)pcVar8;
            process_init_field_designator_cold_4();
LAB_001889a7:
            process_init_field_designator_cold_6();
            pnVar5 = new_node((c2m_ctx_t)designator_member,N_L);
            p.lno = (int)uVar7;
            p.ln_pos = (int)(uVar7 >> 0x20);
            p.fname = extraout_RDX;
            add_pos((c2m_ctx_t)designator_member,pnVar5,p);
            (pnVar5->u).s.s = (char *)__size;
            return;
          }
LAB_00188876:
          uVar7 = pVVar4->els_num;
          if (uVar7 == 0) {
            __size = (node_t_conflict)0x0;
            pnVar5 = get_adjacent_member(designator_member,0);
            pVVar1 = c2m_ctx->init_object_path;
            __ptr = pVVar1->varr;
            if (__ptr != (init_object_t *)0x0) {
              sVar6 = pVVar1->els_num;
              uVar7 = sVar6 + 1;
              if (pVVar1->size < uVar7) {
                sVar6 = (uVar7 >> 1) + uVar7;
                __ptr = (init_object_t *)realloc(__ptr,sVar6 * 0x18);
                pVVar1->varr = __ptr;
                pVVar1->size = sVar6;
                sVar6 = pVVar1->els_num;
                uVar7 = sVar6 + 1;
              }
              pVVar1->els_num = uVar7;
              __ptr[sVar6].container_type = container_type;
              __ptr[sVar6].field_designator_p = 1;
              *(undefined4 *)&__ptr[sVar6].field_0xc = unaff_EBP;
              __ptr[sVar6].u.curr_member = pnVar5;
              return;
            }
            goto LAB_001889a7;
          }
          if (pVVar4->varr == (node_t_conflict *)0x0) goto LAB_0018899d;
          __size = (node_t_conflict)(uVar7 - 1);
          pVVar4->els_num = (size_t)__size;
          pVVar1 = c2m_ctx->init_object_path;
          pcVar3 = (c2m_ctx_t)pVVar1->varr;
          if (pcVar3 == (c2m_ctx_t)0x0) goto LAB_001889a2;
          pnVar10 = pVVar4->varr[uVar7 - 1];
          sVar6 = pVVar1->els_num;
          uVar7 = sVar6 + 1;
          if (pVVar1->size < uVar7) {
            sVar6 = (uVar7 >> 1) + uVar7;
            __size = (node_t_conflict)(sVar6 * 0x18);
            pcVar8 = pcVar3;
            pcVar3 = (c2m_ctx_t)realloc(pcVar3,(size_t)__size);
            pVVar1->varr = (init_object_t *)pcVar3;
            pVVar1->size = sVar6;
            sVar6 = pVVar1->els_num;
            uVar7 = sVar6 + 1;
          }
          pVVar1->els_num = uVar7;
          uVar7 = sVar6 * 3;
          pcVar3->env[0].__jmpbuf[sVar6 * 3 + -2] = (long)container_type;
          *(undefined4 *)(pcVar3->env[0].__jmpbuf + sVar6 * 3 + -1) = 0;
          *(undefined4 *)((long)pcVar3->env[0].__jmpbuf + sVar6 * 0x18 + -4) = unaff_EBP;
          pcVar3->env[0].__jmpbuf[sVar6 * 3] = (long)pnVar10;
          container_type = *(type **)((long)pnVar10->attr + 0x40);
        } while( true );
      }
      goto LAB_00188847;
    }
  }
  process_init_field_designator_cold_7();
LAB_00188847:
  __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
}

Assistant:

static void process_init_field_designator (c2m_ctx_t c2m_ctx, node_t designator_member,
                                           struct type *container_type) {
  decl_t decl;
  init_object_t init_object;
  node_t curr_member;

  assert (designator_member->code == N_MEMBER);
  /* We can have *partial* path of containing anon members: pop them */
  while (VARR_LENGTH (init_object_t, init_object_path) != 0) {
    init_object = VARR_LAST (init_object_t, init_object_path);
    if (!init_object.field_designator_p || (decl = init_object.u.curr_member->attr) == NULL
        || !decl->decl_spec.type->unnamed_anon_struct_union_member_type_p) {
      break;
    }
    container_type = init_object.container_type;
    VARR_POP (init_object_t, init_object_path);
  }
  /* Now add *full* path to designator_member of containing anon members */
  assert (VARR_LENGTH (node_t, containing_anon_members) == 0);
  decl = designator_member->attr;
  for (curr_member = decl->containing_unnamed_anon_struct_union_member; curr_member != NULL;
       curr_member = decl->containing_unnamed_anon_struct_union_member) {
    decl = curr_member->attr;
    VARR_PUSH (node_t, containing_anon_members, curr_member);
  }
  while (VARR_LENGTH (node_t, containing_anon_members) != 0) {
    init_object.u.curr_member = VARR_POP (node_t, containing_anon_members);
    init_object.container_type = container_type;
    init_object.field_designator_p = FALSE;
    VARR_PUSH (init_object_t, init_object_path, init_object);
    container_type = (decl = init_object.u.curr_member->attr)->decl_spec.type;
  }
  init_object.u.curr_member = get_adjacent_member (designator_member, FALSE);
  init_object.container_type = container_type;
  init_object.field_designator_p = TRUE;
  VARR_PUSH (init_object_t, init_object_path, init_object);
}